

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  Buffer *this_00;
  bool bVar1;
  int iVar2;
  double dVar3;
  int length;
  char *data;
  double timeout_local;
  
  this_00 = &this->Output;
  timeout_local = timeout;
  while( true ) {
    bVar1 = Buffer::GetLine(this_00,line);
    if (bVar1) {
      return 2;
    }
    iVar2 = cmsysProcess_WaitForData(this->Process,&data,&length,&timeout_local);
    if (iVar2 != 2) break;
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)this_00,
               (const_iterator)
               (this->Output).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish,data,data + length);
  }
  if (iVar2 != 0xff) {
    bVar1 = Buffer::GetLast(this_00,line);
    if (bVar1) {
      return 2;
    }
    iVar2 = cmsysProcess_WaitForExit(this->Process,&timeout_local);
    if (iVar2 != 0) {
      iVar2 = cmsysProcess_GetExitValue(this->Process);
      this->ExitValue = iVar2;
      dVar3 = cmsys::SystemTools::GetTime();
      dVar3 = dVar3 - this->StartTime;
      this->TotalTime = (double)(~-(ulong)(dVar3 <= 0.0) & (ulong)dVar3);
      return 0;
    }
  }
  return 0xff;
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  for(;;)
    {
    // Look for lines already buffered.
    if(this->Output.GetLine(line))
      {
      return cmsysProcess_Pipe_STDOUT;
      }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if(p == cmsysProcess_Pipe_Timeout)
      {
      return cmsysProcess_Pipe_Timeout;
      }
    else if(p == cmsysProcess_Pipe_STDOUT)
      {
      this->Output.insert(this->Output.end(), data, data+length);
      }
    else // p == cmsysProcess_Pipe_None
      {
      // The process will provide no more data.
      break;
      }
    }

  // Look for partial last lines.
  if(this->Output.GetLast(line))
    {
    return cmsysProcess_Pipe_STDOUT;
    }

  // No more data.  Wait for process exit.
  if(!cmsysProcess_WaitForExit(this->Process, &timeout))
    {
    return cmsysProcess_Pipe_Timeout;
    }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0)
    {
    this->TotalTime = 0.0;
    }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}